

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  uint uVar1;
  istream *inStream;
  ostream *poVar2;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  inStream = this->m_inStream;
  uVar1 = *(uint *)(inStream + *(long *)(*(long *)inStream + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    LoadMtl(matMap,materials,inStream,warn,warn);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Material stream in error state. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (warn != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)warn);
      std::__cxx11::string::~string(asStack_1b8);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *warn, std::string *err) {
  (void)err;
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "Material stream in error state. " << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;
  }

  LoadMtl(matMap, materials, &m_inStream, warn, err);

  return true;
}